

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::UntypedMapBase::ClearTableImpl(UntypedMapBase *this,bool reset)

{
  byte bVar1;
  uint uVar2;
  NodeBase **ppNVar3;
  NodeBase *pNVar4;
  pointer pcVar5;
  NodeBase *pNVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  MessageLite *pMVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar2 = this->num_buckets_;
  uVar10 = (ulong)uVar2;
  if (uVar10 == 1) {
    ClearTableImpl((UntypedMapBase *)&stack0xffffffffffffffc0);
LAB_00f9b099:
    ClearTableImpl();
LAB_00f9b09e:
    ClearTableImpl();
  }
  else {
    if (this->arena_ != (Arena *)0x0) goto LAB_00f9ada4;
    bVar1 = (this->type_info_).field_0x3;
    if (bVar1 < 0x50) {
      if ((bVar1 & 0xf) < 5) {
        uVar9 = (ulong)this->index_of_first_non_null_;
        if (this->index_of_first_non_null_ < uVar2) {
          ppNVar3 = this->table_;
          do {
            pNVar6 = ppNVar3[uVar9];
            while (pNVar6 != (NodeBase *)0x0) {
              pNVar4 = pNVar6->next;
              operator_delete(pNVar6,(ulong)(this->type_info_).node_size);
              pNVar6 = pNVar4;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar10);
        }
LAB_00f9ada4:
        if (!reset) {
          DeleteTable(this,this->table_,this->num_buckets_);
          return;
        }
        uVar2 = this->num_buckets_;
        if ((ulong)uVar2 != 0) {
          memset(this->table_,0,(ulong)uVar2 << 3);
        }
        this->num_elements_ = 0;
        this->index_of_first_non_null_ = uVar2;
        return;
      }
      if ((bVar1 & 0xf) == 5) {
        uVar9 = (ulong)this->index_of_first_non_null_;
        if (this->index_of_first_non_null_ < uVar2) {
          ppNVar3 = this->table_;
          do {
            pNVar6 = ppNVar3[uVar9];
            while (pNVar6 != (NodeBase *)0x0) {
              pNVar4 = pNVar6->next;
              if (pNVar6[1].next != pNVar6 + 3) {
                operator_delete(pNVar6[1].next,(ulong)((long)&(pNVar6[3].next)->next + 1));
              }
              operator_delete(pNVar6,(ulong)(this->type_info_).node_size);
              pNVar6 = pNVar4;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar10);
        }
        goto LAB_00f9ada4;
      }
      goto LAB_00f9b09e;
    }
    if (bVar1 >> 4 != 6) {
      if (bVar1 >> 4 == 5) {
        if ((bVar1 & 0xf) < 5) {
          uVar9 = (ulong)this->index_of_first_non_null_;
          if (this->index_of_first_non_null_ < uVar2) {
            ppNVar3 = this->table_;
            do {
              pNVar6 = ppNVar3[uVar9];
              while (pNVar6 != (NodeBase *)0x0) {
                pNVar4 = pNVar6->next;
                pbVar7 = GetValue<std::__cxx11::string>(this,pNVar6);
                pcVar5 = (pbVar7->_M_dataplus)._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar5 != &pbVar7->field_2) {
                  operator_delete(pcVar5,(pbVar7->field_2)._M_allocated_capacity + 1);
                }
                operator_delete(pNVar6,(ulong)(this->type_info_).node_size);
                pNVar6 = pNVar4;
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar10);
          }
          goto LAB_00f9ada4;
        }
        if ((bVar1 & 0xf) == 5) {
          uVar9 = (ulong)this->index_of_first_non_null_;
          if (this->index_of_first_non_null_ < uVar2) {
            ppNVar3 = this->table_;
            do {
              pNVar6 = ppNVar3[uVar9];
              while (pNVar6 != (NodeBase *)0x0) {
                pNVar4 = pNVar6->next;
                if (pNVar6[1].next != pNVar6 + 3) {
                  operator_delete(pNVar6[1].next,(ulong)((long)&(pNVar6[3].next)->next + 1));
                }
                pbVar7 = GetValue<std::__cxx11::string>(this,pNVar6);
                pcVar5 = (pbVar7->_M_dataplus)._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar5 != &pbVar7->field_2) {
                  operator_delete(pcVar5,(pbVar7->field_2)._M_allocated_capacity + 1);
                }
                operator_delete(pNVar6,(ulong)(this->type_info_).node_size);
                pNVar6 = pNVar4;
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar10);
          }
          goto LAB_00f9ada4;
        }
        goto LAB_00f9b0a8;
      }
      goto LAB_00f9b099;
    }
    if ((bVar1 & 0xf) < 5) {
      uVar9 = (ulong)this->index_of_first_non_null_;
      if (this->index_of_first_non_null_ < uVar2) {
        ppNVar3 = this->table_;
        do {
          pNVar6 = ppNVar3[uVar9];
          while (pNVar6 != (NodeBase *)0x0) {
            pNVar4 = pNVar6->next;
            pMVar8 = GetValue<google::protobuf::MessageLite>(this,pNVar6);
            MessageLite::DestroyInstance(pMVar8);
            operator_delete(pNVar6,(ulong)(this->type_info_).node_size);
            pNVar6 = pNVar4;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar10);
      }
      goto LAB_00f9ada4;
    }
    if ((bVar1 & 0xf) == 5) {
      uVar9 = (ulong)this->index_of_first_non_null_;
      if (this->index_of_first_non_null_ < uVar2) {
        ppNVar3 = this->table_;
        do {
          pNVar6 = ppNVar3[uVar9];
          while (pNVar6 != (NodeBase *)0x0) {
            pNVar4 = pNVar6->next;
            if (pNVar6[1].next != pNVar6 + 3) {
              operator_delete(pNVar6[1].next,(ulong)((long)&(pNVar6[3].next)->next + 1));
            }
            pMVar8 = GetValue<google::protobuf::MessageLite>(this,pNVar6);
            MessageLite::DestroyInstance(pMVar8);
            operator_delete(pNVar6,(ulong)(this->type_info_).node_size);
            pNVar6 = pNVar4;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar10);
      }
      goto LAB_00f9ada4;
    }
  }
  ClearTableImpl();
LAB_00f9b0a8:
  ClearTableImpl();
}

Assistant:

void UntypedMapBase::ClearTableImpl(bool reset) {
  ABSL_DCHECK_NE(num_buckets_, kGlobalEmptyTableSize);

  if (arena_ == nullptr) {
    const auto loop = [this](auto destroy_node) {
      NodeBase** table = table_;
      for (map_index_t b = index_of_first_non_null_, end = num_buckets_;
           b < end; ++b) {
        for (NodeBase* node = table[b]; node != nullptr;) {
          NodeBase* next = node->next;
          absl::PrefetchToLocalCacheNta(next);
          destroy_node(node);
          SizedDelete(node, type_info_.node_size);
          node = next;
        }
      }
    };

    const auto dispatch_key = [&](auto value_handler) {
      if (type_info_.key_type_kind() < TypeKind::kString) {
        loop(value_handler);
      } else if (type_info_.key_type_kind() == TypeKind::kString) {
        loop([=](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidKey())->~basic_string();
          value_handler(node);
        });
      } else {
        Unreachable();
      }
    };

    if (type_info_.value_type_kind() < TypeKind::kString) {
      dispatch_key([](NodeBase*) {});
    } else if (type_info_.value_type_kind() == TypeKind::kString) {
      dispatch_key([&](NodeBase* node) {
        GetValue<std::string>(node)->~basic_string();
      });
    } else if (type_info_.value_type_kind() == TypeKind::kMessage) {
      dispatch_key([&](NodeBase* node) {
        GetValue<MessageLite>(node)->DestroyInstance();
      });
    } else {
      Unreachable();
    }
  }

  if (reset) {
    std::fill(table_, table_ + num_buckets_, nullptr);
    num_elements_ = 0;
    index_of_first_non_null_ = num_buckets_;
  } else {
    DeleteTable(table_, num_buckets_);
  }
}